

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osMutex.cpp
# Opt level: O2

void __thiscall osMutex::osMutex(osMutex *this,char *name)

{
  long lVar1;
  osMutex **ppoVar2;
  long lVar3;
  pthread_mutexattr_t attr;
  
  this->Name = name;
  this->OwnerFile = (char *)0x0;
  this->OwnerThread = (osThread *)0x0;
  pthread_mutexattr_init((pthread_mutexattr_t *)&attr);
  pthread_mutexattr_settype((pthread_mutexattr_t *)&attr,1);
  pthread_mutex_init((pthread_mutex_t *)this,(pthread_mutexattr_t *)&attr);
  StaticInit();
  LockListMutex();
  lVar3 = 0;
  do {
    if (lVar3 == 0x10) goto LAB_00108f48;
    lVar1 = lVar3 + 1;
    ppoVar2 = MutexList + lVar3;
    lVar3 = lVar1;
  } while (*ppoVar2 != (osMutex *)0x0);
  *(osMutex **)(lVar1 * 8 + 0x117728) = this;
LAB_00108f48:
  UnlockListMutex();
  return;
}

Assistant:

osMutex::osMutex(const char* name)
    : Name(name)
    , OwnerFile(nullptr)
    , OwnerThread(nullptr)
{
#ifdef _WIN32
    Handle = CreateMutex(nullptr, false, name);
#elif __linux__
    pthread_mutexattr_t attr;
    pthread_mutexattr_init(&attr);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    pthread_mutex_init(&m_mutex, &attr);
#endif

    StaticInit();
    LockListMutex();
    for (int i = 0; i < MAX_MUTEX; i++)
    {
        if (MutexList[i] == nullptr)
        {
            MutexList[i] = this;
            break;
        }
    }
    UnlockListMutex();
}